

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  options_description_easy_init *poVar2;
  typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *ptVar3;
  basic_command_line_parser<char> *pbVar4;
  size_type sVar5;
  ulong uVar6;
  difference_type dVar7;
  ostream *poVar8;
  bool bVar9;
  undefined1 local_458 [8];
  Flic flic;
  code *local_420;
  undefined8 local_418;
  type local_410;
  _func_bool_path_ptr *local_3f8;
  type local_3f0;
  directory_iterator local_3d0;
  path local_3c8;
  directory_iterator local_3a8;
  int local_39c;
  undefined1 local_398 [4];
  int count;
  path local_378;
  path local_358;
  path local_338;
  byte local_311;
  undefined1 local_310 [7];
  bool compiling;
  byte local_2eb;
  byte local_2ea;
  allocator local_2e9;
  key_type local_2e8;
  allocator local_2c1;
  key_type local_2c0;
  undefined4 local_29c;
  unknown_option *e;
  basic_parsed_options<char> local_218;
  variables_map local_1f0 [8];
  variables_map vm;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  local_1e0 [144];
  positional_options_description local_150 [8];
  positional_options_description pdesc;
  allocator local_111;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  undefined8 local_e0;
  undefined1 local_d8 [8];
  string output;
  string input;
  options_description desc;
  char **argv_local;
  int argc_local;
  
  boost::program_options::options_description::options_description
            ((options_description *)(input.field_2._M_local_buf + 8),0x50,0x28);
  std::__cxx11::string::string((string *)(output.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_d8);
  local_e0 = boost::program_options::options_description::add_options
                       ((options_description *)(input.field_2._M_local_buf + 8));
  poVar2 = (options_description_easy_init *)
           boost::program_options::options_description_easy_init::operator()
                     ((options_description_easy_init *)&local_e0,"help","show program help");
  ptVar3 = boost::program_options::value<std::__cxx11::string>
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      ((long)&output.field_2 + 8));
  poVar2 = (options_description_easy_init *)
           boost::program_options::options_description_easy_init::operator()
                     (poVar2,"input,i",(value_semantic *)ptVar3,
                      "input path to either a Flic file to decompile or a directory of bitmaps to compile"
                     );
  ptVar3 = boost::program_options::value<std::__cxx11::string>
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_110,"",&local_111);
  ptVar3 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::default_value(ptVar3,&local_110);
  boost::program_options::options_description_easy_init::operator()
            (poVar2,"output,o",(value_semantic *)ptVar3,
             "output path to either the compiled Flic file or a directory to put decompiled frames in"
            );
  std::__cxx11::string::~string((string *)&local_110);
  std::allocator<char>::~allocator((allocator<char> *)&local_111);
  boost::program_options::positional_options_description::positional_options_description(local_150);
  boost::program_options::positional_options_description::add(local_150,"input",1);
  boost::program_options::positional_options_description::add(local_150,"output",2);
  boost::program_options::variables_map::variables_map(local_1f0);
  boost::program_options::basic_command_line_parser<char>::basic_command_line_parser
            ((basic_command_line_parser<char> *)&e,argc,argv);
  pbVar4 = boost::program_options::basic_command_line_parser<char>::options
                     ((basic_command_line_parser<char> *)&e,
                      (options_description *)(input.field_2._M_local_buf + 8));
  pbVar4 = boost::program_options::basic_command_line_parser<char>::positional(pbVar4,local_150);
  boost::program_options::basic_command_line_parser<char>::run(&local_218,pbVar4);
  boost::program_options::store((basic_parsed_options *)&local_218,local_1f0,false);
  boost::program_options::basic_parsed_options<char>::~basic_parsed_options(&local_218);
  boost::program_options::basic_command_line_parser<char>::~basic_command_line_parser
            ((basic_command_line_parser<char> *)&e);
  boost::program_options::notify(local_1f0);
  std::allocator<char>::allocator();
  local_2ea = 0;
  local_2eb = 0;
  std::__cxx11::string::string((string *)&local_2c0,"input",&local_2c1);
  sVar5 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count(local_1e0,&local_2c0);
  bVar9 = true;
  if (sVar5 != 0) {
    std::allocator<char>::allocator();
    local_2ea = 1;
    std::__cxx11::string::string((string *)&local_2e8,"help",&local_2e9);
    local_2eb = 1;
    sVar5 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
            ::count(local_1e0,&local_2e8);
    bVar9 = sVar5 != 0;
  }
  if ((local_2eb & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_2e8);
  }
  if ((local_2ea & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_2e9);
  }
  std::__cxx11::string::~string((string *)&local_2c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
  if (bVar9) {
    showHelp((options_description *)(input.field_2._M_local_buf + 8));
    argv_local._4_4_ = 1;
    local_29c = 1;
  }
  else {
    boost::filesystem::path::path((path *)local_310,(string_type *)((long)&output.field_2 + 8));
    bVar9 = boost::filesystem::exists((path *)local_310);
    boost::filesystem::path::~path((path *)local_310);
    if (((bVar9 ^ 0xffU) & 1) == 0) {
      boost::filesystem::path::path(&local_338,(string_type *)((long)&output.field_2 + 8));
      bVar9 = boost::filesystem::is_directory(&local_338);
      boost::filesystem::path::~path(&local_338);
      local_311 = bVar9;
      uVar6 = std::__cxx11::string::empty();
      if ((uVar6 & 1) != 0) {
        if ((local_311 & 1) == 0) {
          std::__cxx11::string::operator=((string *)local_d8,"output");
        }
        else {
          std::__cxx11::string::operator=((string *)local_d8,"output.flh");
        }
      }
      boost::filesystem::path::path(&local_358,(string_type *)local_d8);
      bVar9 = boost::filesystem::exists(&local_358);
      boost::filesystem::path::~path(&local_358);
      if (bVar9) {
        boost::filesystem::path::path(&local_378,(string_type *)local_d8);
        bVar9 = boost::filesystem::is_regular_file(&local_378);
        boost::filesystem::path::~path(&local_378);
        if (bVar9) {
          poVar8 = std::operator<<((ostream *)&std::cout,"Warning: Output file \"");
          poVar8 = std::operator<<(poVar8,(string *)local_d8);
          std::operator<<(poVar8,"\" already exists. Overwrite it? (Y to overwrite, default: no) ");
          bVar9 = prompt();
          if (!bVar9) {
            argv_local._4_4_ = 0;
            local_29c = 1;
            goto LAB_0016d83a;
          }
        }
        else {
          boost::filesystem::path::path((path *)local_398,(string_type *)local_d8);
          bVar9 = boost::filesystem::is_directory((path *)local_398);
          boost::filesystem::path::~path((path *)local_398);
          if (bVar9) {
            boost::filesystem::path::path(&local_3c8,(string_type *)local_d8);
            boost::filesystem::directory_iterator::directory_iterator(&local_3a8,&local_3c8,none);
            boost::filesystem::directory_iterator::directory_iterator(&local_3d0);
            local_3f8 = boost::filesystem::is_regular_file;
            local_420 = boost::filesystem::directory_entry::path;
            local_418 = 0;
            std::
            bind<boost::filesystem::path_const&(boost::filesystem::directory_entry::*)()const,std::_Placeholder<1>const&>
                      (&local_410,(offset_in_directory_entry_to_subr *)&local_420,
                       (_Placeholder<1> *)&std::placeholders::_1);
            std::
            bind<bool(*)(boost::filesystem::path_const&),std::_Bind<boost::filesystem::path_const&(boost::filesystem::directory_entry::*(std::_Placeholder<1>))()const>>
                      (&local_3f0,&local_3f8,&local_410);
            dVar7 = std::
                    count_if<boost::filesystem::directory_iterator,std::_Bind<bool(*(std::_Bind<boost::filesystem::path_const&(boost::filesystem::directory_entry::*(std::_Placeholder<1>))()const>))(boost::filesystem::path_const&)>>
                              (&local_3a8,&local_3d0,&local_3f0);
            iVar1 = (int)dVar7;
            boost::filesystem::directory_iterator::~directory_iterator(&local_3d0);
            boost::filesystem::directory_iterator::~directory_iterator(&local_3a8);
            boost::filesystem::path::~path(&local_3c8);
            local_39c = iVar1;
            if (0 < iVar1) {
              poVar8 = std::operator<<((ostream *)&std::cout,"Warning: Output directory \"");
              poVar8 = std::operator<<(poVar8,(string *)local_d8);
              std::operator<<(poVar8,
                              "\" isn\'t empty. Overwrite any existing frames (if there are any)? (Y to overwrite, default: no) "
                             );
              bVar9 = prompt();
              if (!bVar9) {
                argv_local._4_4_ = 0;
                local_29c = 1;
                goto LAB_0016d83a;
              }
            }
          }
        }
      }
      else if ((local_311 & 1) == 0) {
        boost::filesystem::path::path
                  ((path *)&flic.frames_.super__Vector_base<FlicFrame,_std::allocator<FlicFrame>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,
                   (string_type *)local_d8);
        bVar9 = boost::filesystem::create_directories
                          ((path *)&flic.frames_.
                                    super__Vector_base<FlicFrame,_std::allocator<FlicFrame>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage);
        boost::filesystem::path::~path
                  ((path *)&flic.frames_.super__Vector_base<FlicFrame,_std::allocator<FlicFrame>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
        if (((bVar9 ^ 0xffU) & 1) != 0) {
          poVar8 = std::operator<<((ostream *)&std::cerr,
                                   "Error: Unable to create output directory \"");
          poVar8 = std::operator<<(poVar8,(string *)local_d8);
          poVar8 = std::operator<<(poVar8,
                                   "\". Please make sure that your permissions are set up correctly."
                                  );
          std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
          argv_local._4_4_ = 1;
          local_29c = 1;
          goto LAB_0016d83a;
        }
      }
      Flic::Flic((Flic *)local_458);
      if ((local_311 & 1) == 0) {
        Flic::decompile((Flic *)local_458,(string *)((long)&output.field_2 + 8),(string *)local_d8);
      }
      else {
        Flic::compile((Flic *)local_458,(string *)((long)&output.field_2 + 8),(string *)local_d8);
      }
      argv_local._4_4_ = 0;
      local_29c = 1;
      Flic::~Flic((Flic *)local_458);
    }
    else {
      poVar8 = std::operator<<((ostream *)&std::cerr,"Error: Invalid input path specified: \"");
      poVar8 = std::operator<<(poVar8,(string *)(output.field_2._M_local_buf + 8));
      std::operator<<(poVar8,"\" does not exist.\n");
      argv_local._4_4_ = 1;
      local_29c = 1;
    }
  }
LAB_0016d83a:
  boost::program_options::variables_map::~variables_map(local_1f0);
  boost::program_options::positional_options_description::~positional_options_description(local_150)
  ;
  std::__cxx11::string::~string((string *)local_d8);
  std::__cxx11::string::~string((string *)(output.field_2._M_local_buf + 8));
  boost::program_options::options_description::~options_description
            ((options_description *)(input.field_2._M_local_buf + 8));
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char **argv) {
	po::options_description desc;
	std::string input, output;
	desc.add_options()
		("help", "show program help")
		("input,i", po::value<std::string>(&input), "input path to either a Flic file to decompile or a directory of bitmaps to compile")
		("output,o", po::value<std::string>(&output)->default_value(""), "output path to either the compiled Flic file or a directory to put decompiled frames in")
	;
	po::positional_options_description pdesc;
	pdesc.add("input", 1);
	pdesc.add("output", 2);

	po::variables_map vm;
	try {
		po::store(po::command_line_parser(argc, argv).options(desc).positional(pdesc).run(), vm);
	} catch (po::unknown_option &e) {
		showHelp(desc);
		return 1;
	}
	po::notify(vm);

	// If the user has forgotten to write any arguments or explicitly requested help
	if (!vm.count("input") || vm.count("help")) {
		showHelp(desc);
		return 1;
	}

	// Make sure the input path actually exists
	if (!fs::exists(input)) {
		std::cerr << "Error: Invalid input path specified: \"" << input << "\" does not exist.\n";
		return 1;
	}

	bool compiling = fs::is_directory(input);
	
	if (output.empty()) {
		// We need different default output filenames depending on the desired action
		if (compiling) {
			output = "output.flh";
		} else {
			output = "output";
		}
	}

	if (fs::exists(output)) {
		// We need to check if the user is about to accidentally overwrite already existing files
		if (fs::is_regular_file(output)) {
			std::cout << "Warning: Output file \"" << output << "\" already exists. Overwrite it? (Y to overwrite, default: no) ";
			if (!prompt()) {
				return 0;
			}
		} else if (fs::is_directory(output)) {
			// Check if there are any files in the output directory. Instead of looping through an
			// unknown number of files and checking file names, we just check if the folder isn't
			// empty, in which case we warn the user
			int count = std::count_if(fs::directory_iterator(output), fs::directory_iterator(),
						std::bind(static_cast<bool(*)(const fs::path&)>(fs::is_regular_file), 
						std::bind(&fs::directory_entry::path, std::placeholders::_1)));
			if (count > 0) {
				std::cout << "Warning: Output directory \"" << output << "\" isn't empty. Overwrite any existing frames (if there are any)? (Y to overwrite, default: no) ";
				if (!prompt()) {
					return 0;
				}
			}
		}
	} else if (!compiling) { // If we're decompiling but the output directory doesn't exist, we need to create it
		if (!fs::create_directories(output)) {
			std::cerr << "Error: Unable to create output directory \"" << output << "\". Please make sure that your permissions are set up correctly." << std::endl;
			return 1;
		}
	}

	Flic flic;
	if (compiling) {
		flic.compile(input, output);
	} else {
		flic.decompile(input, output);
	}

	return 0;
}